

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::FindNextNoneWhiteSpace(XFileParser *this)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  if (this->mIsBinaryFormat == false) {
    while( true ) {
      pbVar2 = (byte *)this->mEnd;
      uVar4 = this->mLineNumber;
      pbVar6 = (byte *)this->mP;
      while( true ) {
        pbVar5 = pbVar6 + 1;
        if (pbVar2 <= pbVar6) {
          return;
        }
        bVar1 = *pbVar6;
        iVar3 = isspace((uint)bVar1);
        if (iVar3 == 0) break;
        if (bVar1 == 10) {
          uVar4 = uVar4 + 1;
          this->mLineNumber = uVar4;
        }
        this->mP = (char *)pbVar5;
        pbVar6 = pbVar5;
      }
      if ((bVar1 != 0x23) && ((bVar1 != 0x2f || (*pbVar5 != 0x2f)))) break;
      ReadUntilEndOfLine(this);
    }
  }
  return;
}

Assistant:

void XFileParser::FindNextNoneWhiteSpace()
{
    if( mIsBinaryFormat)
        return;

    bool running = true;
    while( running )
    {
        while( mP < mEnd && isspace( (unsigned char) *mP))
        {
            if( *mP == '\n')
                mLineNumber++;
            ++mP;
        }

        if( mP >= mEnd)
            return;

        // check if this is a comment
        if( (mP[0] == '/' && mP[1] == '/') || mP[0] == '#')
            ReadUntilEndOfLine();
        else
            break;
    }
}